

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryReader::readCustomSection(WasmBinaryReader *this,size_t payloadLen)

{
  size_t sVar1;
  Module *pMVar2;
  pointer pCVar3;
  char *__s2;
  undefined *puVar4;
  int iVar5;
  size_t __n;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_type __rlen;
  Name NVar9;
  string_view sVar10;
  void *local_78 [2];
  long local_68;
  string local_60;
  char *local_40;
  allocator_type local_31;
  
  sVar8 = this->pos;
  NVar9 = getInlineString(this,true);
  __s2 = BinaryConsts::CustomSections::Name;
  local_40 = NVar9.super_IString.str._M_str;
  __n = NVar9.super_IString.str._M_len;
  sVar1 = this->pos;
  uVar6 = sVar1 - sVar8;
  sVar8 = payloadLen - uVar6;
  if (payloadLen < uVar6) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"bad user section size","");
    throwError(this,&local_60);
  }
  sVar7 = strlen(BinaryConsts::CustomSections::Name);
  if ((__n == sVar7) && ((__n == 0 || (iVar5 = bcmp(local_40,__s2,__n), iVar5 == 0)))) {
    this->pos = sVar8 + sVar1;
    return;
  }
  puVar4 = BinaryConsts::CustomSections::TargetFeatures;
  sVar7 = strlen(BinaryConsts::CustomSections::TargetFeatures);
  if ((__n == sVar7) && ((__n == 0 || (iVar5 = bcmp(local_40,puVar4,__n), iVar5 == 0)))) {
    readFeatures(this,sVar8);
    return;
  }
  puVar4 = BinaryConsts::CustomSections::Dylink;
  sVar7 = strlen(BinaryConsts::CustomSections::Dylink);
  if ((__n == sVar7) && ((__n == 0 || (iVar5 = bcmp(local_40,puVar4,__n), iVar5 == 0)))) {
    readDylink(this,sVar8);
    return;
  }
  puVar4 = BinaryConsts::CustomSections::Dylink0;
  sVar7 = strlen(BinaryConsts::CustomSections::Dylink0);
  if ((__n == sVar7) && ((__n == 0 || (iVar5 = bcmp(local_40,puVar4,__n), iVar5 == 0)))) {
    readDylink0(this,sVar8);
    return;
  }
  puVar4 = BinaryConsts::CustomSections::Linking;
  sVar7 = strlen(BinaryConsts::CustomSections::Linking);
  if ((__n == sVar7) && ((__n == 0 || (iVar5 = bcmp(local_40,puVar4,__n), iVar5 == 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: linking section is present, so this is not a standard wasm file - binaryen cannot handle this properly!\n"
               ,0x71);
  }
  pMVar2 = this->wasm;
  std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::resize
            (&pMVar2->customSections,
             ((long)(pMVar2->customSections).
                    super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pMVar2->customSections).
                    super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 + 1);
  pCVar3 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_replace
            ((ulong)(pCVar3 + -1),0,(char *)pCVar3[-1].name._M_string_length,(ulong)local_40);
  sVar10 = getByteView(this,sVar8);
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)local_78,sVar10._M_str,
             sVar10._M_str + sVar10._M_len,&local_31);
  std::vector<char,_std::allocator<char>_>::_M_move_assign
            (&pCVar3[-1].data,(vector<char,std::allocator<char>> *)local_78);
  if (local_78[0] != (void *)0x0) {
    operator_delete(local_78[0],local_68 - (long)local_78[0]);
  }
  return;
}

Assistant:

void WasmBinaryReader::readCustomSection(size_t payloadLen) {
  auto oldPos = pos;
  Name sectionName = getInlineString();
  size_t read = pos - oldPos;
  if (read > payloadLen) {
    throwError("bad user section size");
  }
  payloadLen -= read;
  if (sectionName.equals(BinaryConsts::CustomSections::Name)) {
    // We already read the name section before anything else.
    pos += payloadLen;
  } else if (sectionName.equals(BinaryConsts::CustomSections::TargetFeatures)) {
    readFeatures(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink)) {
    readDylink(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink0)) {
    readDylink0(payloadLen);
  } else {
    // an unfamiliar custom section
    if (sectionName.equals(BinaryConsts::CustomSections::Linking)) {
      std::cerr
        << "warning: linking section is present, so this is not a standard "
           "wasm file - binaryen cannot handle this properly!\n";
    }
    wasm.customSections.resize(wasm.customSections.size() + 1);
    auto& section = wasm.customSections.back();
    section.name = sectionName.str;
    auto data = getByteView(payloadLen);
    section.data = {data.begin(), data.end()};
  }
}